

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::eliminate(SimpSolver *this,bool turn_off_elim)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Lit LVar6;
  Ref RVar7;
  Ref RVar8;
  Clause *this_00;
  long *in_RDI;
  double dVar9;
  double dVar10;
  double var_dec_rate;
  double cl_inc_rate;
  int n_vars_now;
  int n_cls_now;
  int n_vars_last;
  int n_cls_last;
  int j;
  Clause *c;
  int i;
  int n_vars;
  int n_cls_init;
  int n_cls;
  int iter;
  bool res;
  Ref in_stack_ffffffffffffff6c;
  undefined1 dealloc;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff70;
  long *in_stack_ffffffffffffff78;
  undefined1 dealloc_00;
  Solver *in_stack_ffffffffffffff80;
  SimpSolver *in_stack_ffffffffffffff90;
  int local_64;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int local_2c;
  int local_20;
  uint local_10;
  bool local_a;
  
  local_a = true;
  local_10 = 0;
  *(undefined4 *)(in_RDI + 0x31) = 1;
  iVar2 = Solver::nVars((Solver *)0x15ae9a);
  if (iVar2 != 0) {
    iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x6a));
    if (iVar2 != 0) {
      removeSatisfied(in_stack_ffffffffffffff90);
    }
    iVar2 = Solver::nClauses((Solver *)0x15aece);
    local_a = eliminate_((SimpSolver *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                        );
    if (local_a) {
      uVar3 = Solver::nClauses((Solver *)0x15af01);
      uVar4 = Solver::nFreeVars(in_stack_ffffffffffffff80);
      if (0 < *(int *)((long)in_RDI + 0x34)) {
        printf("c Reduced to %d vars, %d cls (grow=%d)\n",(ulong)uVar4,(ulong)uVar3,
               (ulong)*(uint *)((long)in_RDI + 0x13fc));
      }
      if ((10.0 <= (double)(int)uVar3 / (double)(int)uVar4) || ((int)uVar4 < 10000)) {
        if (0 < *(int *)((long)in_RDI + 0x34)) {
          printf("c No iterative elimination performed. (vars=%d, c/v ratio=%.1f)\n",
                 (double)(int)uVar3 / (double)(int)uVar4,(ulong)uVar4);
        }
      }
      else {
        if (*(int *)((long)in_RDI + 0x13fc) == 0) {
          local_64 = 8;
        }
        else {
          local_64 = *(int *)((long)in_RDI + 0x13fc) << 1;
        }
        *(int *)((long)in_RDI + 0x13fc) = local_64;
        while (*(int *)((long)in_RDI + 0x13fc) < 10000) {
          for (local_20 = 0; iVar5 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x46)),
              local_20 < iVar5; local_20 = local_20 + 1) {
            vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x46),local_20);
            this_00 = ClauseAllocator::operator[]
                                ((ClauseAllocator *)in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff6c);
            for (local_2c = 0; iVar5 = Clause::size(this_00), local_2c < iVar5;
                local_2c = local_2c + 1) {
              in_stack_ffffffffffffff80 = (Solver *)(in_RDI + 0x294);
              LVar6 = Clause::operator[](this_00,local_2c);
              var(LVar6);
              bVar1 = Heap<Minisat::SimpSolver::ElimLt>::inHeap
                                ((Heap<Minisat::SimpSolver::ElimLt> *)in_stack_ffffffffffffff80,
                                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                in_stack_ffffffffffffff70 =
                     (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
                      *)(in_RDI + 0x294);
                LVar6 = Clause::operator[](this_00,local_2c);
                var(LVar6);
                Heap<Minisat::SimpSolver::ElimLt>::update
                          ((Heap<Minisat::SimpSolver::ElimLt> *)in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c);
              }
              else {
                in_stack_ffffffffffffff78 = in_RDI + 0x294;
                LVar6 = Clause::operator[](this_00,local_2c);
                var(LVar6);
                Heap<Minisat::SimpSolver::ElimLt>::insert
                          ((Heap<Minisat::SimpSolver::ElimLt> *)in_stack_ffffffffffffff80,
                           (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
              }
            }
          }
          iVar5 = Solver::nClauses((Solver *)0x15b15f);
          RVar7 = Solver::nFreeVars(in_stack_ffffffffffffff80);
          local_a = eliminate_((SimpSolver *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if ((!local_a) ||
             (in_stack_ffffffffffffff6c = RVar7,
             RVar8 = Solver::nFreeVars(in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff6c == RVar8)) break;
          local_10 = local_10 + 1;
          in_stack_ffffffffffffffbc = Solver::nClauses((Solver *)0x15b1ca);
          in_stack_ffffffffffffffb8 = Solver::nFreeVars(in_stack_ffffffffffffff80);
          dVar9 = (double)(int)in_stack_ffffffffffffffbc;
          dVar10 = (double)(int)in_stack_ffffffffffffffb8;
          if (0 < *(int *)((long)in_RDI + 0x34)) {
            printf("c Reduced to %d vars, %d cls (grow=%d)\n",(ulong)in_stack_ffffffffffffffb8,
                   (ulong)in_stack_ffffffffffffffbc,(ulong)*(uint *)((long)in_RDI + 0x13fc));
            printf("c cl_inc_rate=%.3f, var_dec_rate=%.3f\n",dVar9 / (double)iVar5,
                   (double)(int)RVar7 / dVar10);
          }
          if ((iVar2 < (int)in_stack_ffffffffffffffbc) ||
             ((double)(int)RVar7 / dVar10 < dVar9 / (double)iVar5)) break;
          *(int *)((long)in_RDI + 0x13fc) = *(int *)((long)in_RDI + 0x13fc) << 1;
        }
        if (0 < *(int *)((long)in_RDI + 0x34)) {
          printf("c No. effective iterative eliminations: %d\n",(ulong)local_10);
        }
      }
    }
  }
  dealloc_00 = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  dealloc = (undefined1)(in_stack_ffffffffffffff6c >> 0x18);
  vec<char>::clear((vec<char> *)in_stack_ffffffffffffff70,(bool)dealloc);
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (in_stack_ffffffffffffff70,(bool)dealloc);
  vec<int>::clear((vec<int> *)in_stack_ffffffffffffff70,(bool)dealloc);
  Heap<Minisat::SimpSolver::ElimLt>::clear
            ((Heap<Minisat::SimpSolver::ElimLt> *)in_stack_ffffffffffffff80,(bool)dealloc_00);
  Queue<unsigned_int>::clear((Queue<unsigned_int> *)in_stack_ffffffffffffff70,(bool)dealloc);
  *(undefined1 *)(in_RDI + 0x286) = 0;
  *(undefined1 *)(in_RDI + 0x92) = 1;
  *(undefined1 *)((long)in_RDI + 0x51c) = 0;
  Solver::rebuildOrderHeap(in_stack_ffffffffffffff80);
  (**(code **)(*in_RDI + 0x10))();
  *(undefined4 *)(in_RDI + 0x31) = 0;
  return local_a;
}

Assistant:

bool SimpSolver::eliminate(bool turn_off_elim)
{
    bool res = true;
    int iter = 0;
    int n_cls, n_cls_init, n_vars;

    systematic_branching_state = 1;

    if (nVars() == 0) goto cleanup; // User disabling preprocessing.

    // Get an initial number of clauses (more accurately).
    if (trail.size() != 0) removeSatisfied();
    n_cls_init = nClauses();

    res = eliminate_(); // The first, usual variable elimination of MiniSat.
    if (!res) goto cleanup;

    n_cls = nClauses();
    n_vars = nFreeVars();

    if (verbosity >= 1) printf("c Reduced to %d vars, %d cls (grow=%d)\n", n_vars, n_cls, grow);

    if ((double)n_cls / n_vars >= 10 || n_vars < 10000) {
        if (verbosity > 0)
            printf("c No iterative elimination performed. (vars=%d, c/v ratio=%.1f)\n", n_vars, (double)n_cls / n_vars);
        goto cleanup;
    }

    grow = grow ? grow * 2 : 8;
    for (; grow < 10000; grow *= 2) {
        // Rebuild elimination variable heap.
        for (int i = 0; i < clauses.size(); i++) {
            const Clause &c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (!elim_heap.inHeap(var(c[j])))
                    elim_heap.insert(var(c[j]));
                else
                    elim_heap.update(var(c[j]));
        }

        int n_cls_last = nClauses();
        int n_vars_last = nFreeVars();

        res = eliminate_();
        if (!res || n_vars_last == nFreeVars()) break;
        iter++;

        int n_cls_now = nClauses();
        int n_vars_now = nFreeVars();

        double cl_inc_rate = (double)n_cls_now / n_cls_last;
        double var_dec_rate = (double)n_vars_last / n_vars_now;

        if (verbosity >= 1) {
            printf("c Reduced to %d vars, %d cls (grow=%d)\n", n_vars_now, n_cls_now, grow);
            printf("c cl_inc_rate=%.3f, var_dec_rate=%.3f\n", cl_inc_rate, var_dec_rate);
        }

        if (n_cls_now > n_cls_init || cl_inc_rate > var_dec_rate) break;
    }
    if (verbosity >= 1) printf("c No. effective iterative eliminations: %d\n", iter);

cleanup:
    touched.clear(true);
    occurs.clear(true);
    n_occ.clear(true);
    elim_heap.clear(true);
    subsumption_queue.clear(true);

    use_simplification = false;
    remove_satisfied = true;
    ca.extra_clause_field = false;

    // Force full cleanup (this is safe and desirable since it only happens once):
    rebuildOrderHeap();
    garbageCollect();

    systematic_branching_state = 0;
    return res;
}